

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O3

err_t EnumDir(filestream *p,tchar_t *Exts,bool_t ExtFilter,streamdir *Item)

{
  datetime_t dVar1;
  int iVar2;
  err_t eVar3;
  dirent64 *pdVar4;
  stat file_stats;
  tchar_t FilePath [256];
  stat64 local_1c8;
  tchar_t local_138 [264];
  
  eVar3 = -9;
  if (p->FindDir != (DIR *)0x0) {
    Item->FileName[0] = '\0';
    Item->Size = -1;
LAB_00114367:
    do {
      pdVar4 = readdir64((DIR *)p->FindDir);
      if (pdVar4 == (dirent64 *)0x0) {
        if (Item->FileName[0] == '\0') {
          closedir((DIR *)p->FindDir);
          p->FindDir = (DIR *)0x0;
          return -9;
        }
        break;
      }
      if (pdVar4->d_name[0] != '.') {
        tcscpy_s(local_138,0x100,p->DirPath);
        tcscat_s(local_138,0x100,pdVar4->d_name);
        tcscpy_s(Item->FileName,0x100,pdVar4->d_name);
        stat64(local_138,&local_1c8);
        dVar1 = LinuxToDateTime(local_1c8.st_mtim.tv_sec);
        Item->ModifiedDate = dVar1;
        if ((local_1c8.st_mode & 0xf000) == 0x4000) {
          Item->Type = 0x44;
          Item->Size = -1;
        }
        else {
          Item->Size = local_1c8.st_size;
          iVar2 = CheckExts(Item->FileName,Exts);
          Item->Type = iVar2;
          if (iVar2 == 0 && ExtFilter != 0) {
            Item->FileName[0] = '\0';
            goto LAB_00114367;
          }
        }
      }
    } while (Item->FileName[0] == '\0');
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

static err_t EnumDir(filestream* p,const tchar_t* Exts,bool_t ExtFilter,streamdir* Item)
{
    struct dirent *Dirent;

    if (!p->FindDir)
        return ERR_END_OF_FILE;

    Item->FileName[0] = 0;
    Item->Size = INVALID_FILEPOS_T;

    while (!Item->FileName[0] && (Dirent = readdir(p->FindDir)) != NULL)
    {
        tchar_t FilePath[MAXPATH];
        struct stat file_stats;

        if (Dirent->d_name[0]=='.') // skip hidden files and current directory
            continue;

        tcscpy_s(FilePath, TSIZEOF(FilePath), p->DirPath);
        tcscat_s(FilePath, TSIZEOF(FilePath), Dirent->d_name);
        tcscpy_s(Item->FileName,TSIZEOF(Item->FileName), Dirent->d_name);

        stat(FilePath, &file_stats);

        Item->ModifiedDate = LinuxToDateTime(file_stats.st_mtime);
        if (S_ISDIR(file_stats.st_mode))
        {
            Item->Type = FTYPE_DIR;
            Item->Size = INVALID_FILEPOS_T;
        }
        else
        {
            Item->Size = file_stats.st_size;
            Item->Type = CheckExts(Item->FileName,Exts);

            if (!Item->Type && ExtFilter)
                Item->FileName[0] = 0; // skip
        }
    }

    if (!Item->FileName[0])
    {
        closedir(p->FindDir);
        p->FindDir = NULL;
        return ERR_END_OF_FILE;
    }

    return ERR_NONE;
}